

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O2

void __thiscall egc::Sequencer::INDEXE(Sequencer *this,unsigned_short instruction)

{
  unsigned_short index;
  ostream *poVar1;
  ushort address;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"INDEXE");
  poVar1 = std::operator<<(poVar1," ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  address = instruction & 0xfff;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,address);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar1);
  index = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,address,0);
  Memory::SetIndex((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,index);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address,index);
  Memory::SetExtendFlag
            ((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void egc::Sequencer::INDEXE (unsigned short instruction)
{
    unsigned short k = instruction & 007777u;

    std::cout << "INDEXE" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    m_Memory->SetIndex(mk);

    m_Memory->Write(k, mk);

    m_Memory->SetExtendFlag();
}